

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O0

Vec_Ptr_t * Aig_ManDfsChoices(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *vNodes_00;
  int local_24;
  int Counter;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_24);
    if (((pAVar2 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar2), iVar1 != 0)) &&
       (pAVar3 = Aig_ObjEquiv(p,pAVar2), pAVar3 != (Aig_Obj_t *)0x0)) {
      for (_Counter = Aig_ObjEquiv(p,pAVar2); _Counter != (Aig_Obj_t *)0x0;
          _Counter = Aig_ObjEquiv(p,_Counter)) {
      }
    }
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    Aig_ManIncrementTravId(p);
    pAVar2 = Aig_ManConst1(p);
    Aig_ObjSetTravIdCurrent(p,pAVar2);
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCis), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_24);
      Aig_ObjSetTravIdCurrent(p,pAVar2);
    }
    iVar1 = Aig_ManNodeNum(p);
    vNodes_00 = Vec_PtrAlloc(iVar1);
    for (local_24 = 0; iVar1 = Vec_PtrSize(p->vCos), local_24 < iVar1; local_24 = local_24 + 1) {
      pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_24);
      pAVar2 = Aig_ObjFanin0(pAVar2);
      Aig_ManDfsChoices_rec(p,pAVar2,vNodes_00);
    }
    return vNodes_00;
  }
  __assert_fail("p->pEquivs != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigDfs.c"
                ,0x198,"Vec_Ptr_t *Aig_ManDfsChoices(Aig_Man_t *)");
}

Assistant:

Vec_Ptr_t * Aig_ManDfsChoices( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i, Counter = 0;

    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Aig_ObjEquiv(p, pObj) == NULL )
            continue;
        Counter = 0;
        for ( pObj = Aig_ObjEquiv(p, pObj) ; pObj; pObj = Aig_ObjEquiv(p, pObj) )
            Counter++;
//        printf( "%d ", Counter );
    }
//    printf( "\n" );

    assert( p->pEquivs != NULL );
    Aig_ManIncrementTravId( p );
    // mark constant and PIs
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachCi( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );
    // go through the nodes
    vNodes = Vec_PtrAlloc( Aig_ManNodeNum(p) );
    Aig_ManForEachCo( p, pObj, i )
        Aig_ManDfsChoices_rec( p, Aig_ObjFanin0(pObj), vNodes );
    return vNodes;
}